

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O0

void rw::wdgl::instance(ObjPipeline *rwpipe,Atomic *atomic)

{
  Geometry *pGVar1;
  undefined4 *puVar2;
  AttribDesc *a_00;
  int iVar3;
  InstanceDataHeader *pIVar4;
  void *pvVar5;
  int local_9c;
  float local_98;
  int32 i_4;
  float32 f [4];
  RGBA *color;
  V3d *pVStack_78;
  int32 i_3;
  V3d *norm;
  TexCoords *pTStack_68;
  int32 i_2;
  TexCoords *texcoord;
  V3d *pVStack_58;
  int32 i_1;
  V3d *vert;
  uint8 *p;
  int32 i;
  int32 firstCustom;
  AttribDesc *a;
  int32 offset;
  InstanceDataHeader *header;
  Geometry *geo;
  ObjPipeline *pipe;
  Atomic *atomic_local;
  ObjPipeline *rwpipe_local;
  
  pGVar1 = atomic->geometry;
  if (pGVar1->instData == (InstanceDataHeader *)0x0) {
    pIVar4 = (InstanceDataHeader *)
             mustmalloc_LOC(0x28,0x3000f,
                            "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/gl/wdgl.cpp line: 330"
                           );
    pGVar1->instData = pIVar4;
    pIVar4->platform = 0xb;
    pIVar4[8].platform = 0;
    pIVar4[9].platform = 0;
    pIVar4[1].platform = rwpipe[1].super_Pipeline.pluginID + 1 + (uint)(0 < pGVar1->numTexCoordSets)
    ;
    if ((pGVar1->flags & 8) != 0) {
      pIVar4[1].platform = pIVar4[1].platform + 1;
    }
    if ((pGVar1->flags & 0x10) != 0) {
      pIVar4[1].platform = pIVar4[1].platform + 1;
    }
    pvVar5 = mustmalloc_LOC((long)(int)pIVar4[1].platform * 0x18,0x3000f,
                            "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/gl/wdgl.cpp line: 342"
                           );
    *(void **)(pIVar4 + 2) = pvVar5;
    puVar2 = *(undefined4 **)(pIVar4 + 2);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2[2] = 0;
    puVar2[3] = 3;
    puVar2[5] = 0;
    a._4_4_ = 0xc;
    _i = (AttribDesc *)(puVar2 + 6);
    p._4_4_ = 1;
    if (pGVar1->numTexCoordSets != 0) {
      *(undefined4 *)_i = 1;
      puVar2[7] = 3;
      puVar2[8] = 0;
      puVar2[9] = 2;
      puVar2[0xb] = 0xc;
      a._4_4_ = 0x10;
      _i = (AttribDesc *)(puVar2 + 0xc);
      p._4_4_ = 2;
    }
    if ((pGVar1->flags & 0x10) != 0) {
      _i->index = 2;
      *(undefined4 *)((long)_i + 4) = 1;
      *(undefined4 *)((long)_i + 8) = 1;
      *(undefined4 *)((long)_i + 0xc) = 3;
      *(uint32 *)((long)_i + 0x14) = a._4_4_;
      a._4_4_ = a._4_4_ + 4;
      _i = (AttribDesc *)((long)_i + 0x18);
      p._4_4_ = p._4_4_ + 1;
    }
    if ((pGVar1->flags & 8) != 0) {
      _i->index = 3;
      *(undefined4 *)((long)_i + 4) = 2;
      *(undefined4 *)((long)_i + 8) = 1;
      *(undefined4 *)((long)_i + 0xc) = 4;
      *(uint32 *)((long)_i + 0x14) = a._4_4_;
      a._4_4_ = a._4_4_ + 4;
      p._4_4_ = p._4_4_ + 1;
    }
    if (*(long *)&rwpipe[1].super_Pipeline.platform == 0) {
      pIVar4[4].platform = a._4_4_ * pGVar1->numVertices;
      pvVar5 = mustmalloc_LOC((ulong)pIVar4[4].platform,0x3000f,
                              "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/gl/wdgl.cpp line: 393"
                             );
      *(void **)(pIVar4 + 6) = pvVar5;
    }
    else {
      iVar3 = (**(code **)&rwpipe[1].super_Pipeline.platform)(pGVar1,p._4_4_,a._4_4_);
      a._4_4_ = iVar3 + a._4_4_;
    }
    a_00 = *(AttribDesc **)(pIVar4 + 2);
    for (p._0_4_ = 0; (int)p < (int)pIVar4[1].platform; p._0_4_ = (int)p + 1) {
      a_00[(int)p].stride = a._4_4_;
    }
    vert = (V3d *)(*(long *)(pIVar4 + 6) + (ulong)a_00->offset);
    pVStack_58 = pGVar1->morphTargets->vertices;
    for (texcoord._4_4_ = 0; texcoord._4_4_ < pGVar1->numVertices;
        texcoord._4_4_ = texcoord._4_4_ + 1) {
      packattrib((uint8 *)vert,&pVStack_58->x,a_00,1.0);
      pVStack_58 = pVStack_58 + 1;
      vert = (V3d *)((long)&vert->x + (ulong)a_00->stride);
    }
    _i = a_00 + 1;
    if (pGVar1->numTexCoordSets != 0) {
      vert = (V3d *)(*(long *)(pIVar4 + 6) + (ulong)a_00[1].offset);
      pTStack_68 = pGVar1->texCoords[0];
      for (norm._4_4_ = 0; norm._4_4_ < pGVar1->numVertices; norm._4_4_ = norm._4_4_ + 1) {
        packattrib((uint8 *)vert,&pTStack_68->u,_i,512.0);
        pTStack_68 = pTStack_68 + 1;
        vert = (V3d *)((long)&vert->x + (ulong)a_00[1].stride);
      }
      _i = a_00 + 2;
    }
    if ((pGVar1->flags & 0x10) != 0) {
      vert = (V3d *)(*(long *)(pIVar4 + 6) + (ulong)_i->offset);
      pVStack_78 = pGVar1->morphTargets->normals;
      for (color._4_4_ = 0; color._4_4_ < pGVar1->numVertices; color._4_4_ = color._4_4_ + 1) {
        packattrib((uint8 *)vert,&pVStack_78->x,_i,1.0);
        pVStack_78 = pVStack_78 + 1;
        vert = (V3d *)((long)&vert->x + (ulong)_i->stride);
      }
      _i = _i + 1;
    }
    if ((pGVar1->flags & 8) != 0) {
      vert = (V3d *)(*(long *)(pIVar4 + 6) + (ulong)_i->offset);
      f._8_8_ = pGVar1->colors;
      for (local_9c = 0; local_9c < pGVar1->numVertices; local_9c = local_9c + 1) {
        local_98 = (float)*(byte *)f._8_8_ / 255.0;
        i_4 = (int32)((float)*(byte *)(f._8_8_ + 1) / 255.0);
        f[0] = (float32)((float)*(byte *)(f._8_8_ + 2) / 255.0);
        f[1] = (float32)((float)*(byte *)(f._8_8_ + 3) / 255.0);
        packattrib((uint8 *)vert,(float32 *)&local_98,_i,1.0);
        f._8_8_ = f._8_8_ + 4;
        vert = (V3d *)((long)&vert->x + (ulong)_i->stride);
      }
    }
  }
  return;
}

Assistant:

static void
instance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	// TODO: allow for REINSTANCE (or not, wdgl can't render)
	if(geo->instData)
		return;
	InstanceDataHeader *header = rwNewT(InstanceDataHeader, 1, MEMDUR_EVENT | ID_GEOMETRY);
	geo->instData = header;
	header->platform = PLATFORM_WDGL;
	header->vbo = 0;
	header->ibo = 0;
	header->numAttribs =
		pipe->numCustomAttribs + 1 + (geo->numTexCoordSets > 0);
	if(geo->flags & Geometry::PRELIT)
		header->numAttribs++;
	if(geo->flags & Geometry::NORMALS)
		header->numAttribs++;
	int32 offset = 0;
	header->attribs = rwNewT(AttribDesc, header->numAttribs, MEMDUR_EVENT | ID_GEOMETRY);

	AttribDesc *a = header->attribs;
	// Vertices
	a->index = 0;
	a->type = 0;
	a->normalized = 0;
	a->size = 3;
	a->offset = offset;
	offset += 12;
	a++;
	int32 firstCustom = 1;

	// texCoords, only one set here
	if(geo->numTexCoordSets){
		a->index = 1;
		a->type = 3;
		a->normalized = 0;
		a->size = 2;
		a->offset = offset;
		offset += 4;
		a++;
		firstCustom++;
	}

	if(geo->flags & Geometry::NORMALS){
		a->index = 2;
		a->type = 1;
		a->normalized = 1;
		a->size = 3;
		a->offset = offset;
		offset += 4;
		a++;
		firstCustom++;
	}

	if(geo->flags & Geometry::PRELIT){
		a->index = 3;
		a->type = 2;
		a->normalized = 1;
		a->size = 4;
		a->offset = offset;
		offset += 4;
		a++;
		firstCustom++;
	}

	if(pipe->instanceCB)
		offset += pipe->instanceCB(geo, firstCustom, offset);
	else{
		header->dataSize = offset*geo->numVertices;
		header->data = rwNewT(uint8, header->dataSize, MEMDUR_EVENT | ID_GEOMETRY);
	}

	a = header->attribs;
	for(int32 i = 0; i < header->numAttribs; i++)
		a[i].stride = offset;

	uint8 *p = header->data + a->offset;
	V3d *vert = geo->morphTargets->vertices;
	for(int32 i = 0; i < geo->numVertices; i++){
		packattrib(p, (float32*)vert, a);
		vert++;
		p += a->stride;
	}
	a++;

	if(geo->numTexCoordSets){
		p = header->data + a->offset;
		TexCoords *texcoord = geo->texCoords[0];
		for(int32 i = 0; i < geo->numVertices; i++){
			packattrib(p, (float32*)texcoord, a, 512.0f);
			texcoord++;
			p += a->stride;
		}
		a++;
	}

	if(geo->flags & Geometry::NORMALS){
		p = header->data + a->offset;
		V3d *norm = geo->morphTargets->normals;
		for(int32 i = 0; i < geo->numVertices; i++){
			packattrib(p, (float32*)norm, a);
			norm++;
			p += a->stride;
		}
		a++;
	}

	if(geo->flags & Geometry::PRELIT){
		// TODO: this seems too complicated
		p = header->data + a->offset;
		RGBA *color = geo->colors;
		float32 f[4];
		for(int32 i = 0; i < geo->numVertices; i++){
			f[0] = color->red/255.0f;
			f[1] = color->green/255.0f;
			f[2] = color->blue/255.0f;
			f[3] = color->alpha/255.0f;
			packattrib(p, (float32*)f, a);
			color++;
			p += a->stride;
		}
		a++;
	}
}